

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestHG.cxx
# Opt level: O3

bool __thiscall cmCTestHG::UpdateImpl(cmCTestHG *this)

{
  _func_int **pp_Var1;
  cmCTest *pcVar2;
  bool bVar3;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *command;
  pointer pbVar4;
  vector<const_char_*,_std::allocator<const_char_*>_> hg_update;
  OutputLogger out;
  string opts;
  OutputLogger err;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  char **local_108;
  iterator iStack_100;
  char **local_f8;
  undefined1 local_e8 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  undefined1 local_a8 [16];
  char *local_98 [2];
  undefined1 local_88 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_a8._0_8_ = (this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool._M_dataplus._M_p;
  local_a8._8_8_ = "pull";
  local_98[0] = "-v";
  local_98[1] = (char *)0x0;
  cmProcessTools::OutputLogger::OutputLogger
            ((OutputLogger *)local_e8,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"pull-out> "
            );
  cmProcessTools::OutputLogger::OutputLogger
            ((OutputLogger *)local_88,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"pull-err> "
            );
  cmCTestVC::RunChild((cmCTestVC *)this,(char **)local_a8,(OutputParser *)local_e8,
                      (OutputParser *)local_88,(char *)0x0,Auto);
  local_88._0_8_ = &PTR__LineParser_007830e8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._24_8_ != &local_60) {
    operator_delete((void *)local_88._24_8_,local_60._M_allocated_capacity + 1);
  }
  local_e8._0_8_ = &PTR__LineParser_007830e8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._24_8_ != &local_c0) {
    operator_delete((void *)local_e8._24_8_,local_c0._M_allocated_capacity + 1);
  }
  local_108 = (char **)0x0;
  iStack_100._M_current = (char **)0x0;
  local_f8 = (char **)0x0;
  local_e8._0_8_ = (this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool._M_dataplus._M_p;
  std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_108,(iterator)0x0,
             (char **)local_e8);
  local_e8._0_8_ = "update";
  if (iStack_100._M_current == local_f8) {
    std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&local_108,iStack_100,
               (char **)local_e8);
  }
  else {
    *iStack_100._M_current = "update";
    iStack_100._M_current = iStack_100._M_current + 1;
  }
  local_e8._0_8_ = "-v";
  if (iStack_100._M_current == local_f8) {
    std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&local_108,iStack_100,
               (char **)local_e8);
  }
  else {
    *iStack_100._M_current = "-v";
    iStack_100._M_current = iStack_100._M_current + 1;
  }
  pcVar2 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
  pp_Var1 = (_func_int **)(local_e8 + 0x10);
  local_e8._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"UpdateOptions","");
  cmCTest::GetCTestConfiguration((string *)local_a8,pcVar2,(string *)local_e8);
  command = extraout_RDX;
  if ((_func_int **)local_e8._0_8_ != pp_Var1) {
    operator_delete((void *)local_e8._0_8_,(ulong)(local_e8._16_8_ + 1));
    command = extraout_RDX_00;
  }
  if ((char *)local_a8._8_8_ == (char *)0x0) {
    pcVar2 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
    local_88._0_8_ = local_88 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"HGUpdateOptions","");
    cmCTest::GetCTestConfiguration((string *)local_e8,pcVar2,(string *)local_88);
    std::__cxx11::string::operator=((string *)local_a8,(string *)local_e8);
    command = extraout_RDX_01;
    if ((_func_int **)local_e8._0_8_ != pp_Var1) {
      operator_delete((void *)local_e8._0_8_,(ulong)(local_e8._16_8_ + 1));
      command = extraout_RDX_02;
    }
    if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
      operator_delete((void *)local_88._0_8_,(ulong)(local_88._16_8_ + 1));
      command = extraout_RDX_03;
    }
  }
  cmSystemTools::ParseArguments_abi_cxx11_(&local_48,(cmSystemTools *)local_a8._0_8_,command);
  if (local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar4 = local_48.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_e8._0_8_ = (pbVar4->_M_dataplus)._M_p;
      if (iStack_100._M_current == local_f8) {
        std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                  ((vector<char_const*,std::allocator<char_const*>> *)&local_108,iStack_100,
                   (char **)local_e8);
      }
      else {
        *iStack_100._M_current = (char *)local_e8._0_8_;
        iStack_100._M_current = iStack_100._M_current + 1;
      }
      pbVar4 = pbVar4 + 1;
    } while (pbVar4 != local_48.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_e8._0_8_ = (_func_int **)0x0;
  if (iStack_100._M_current == local_f8) {
    std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&local_108,iStack_100,
               (char **)local_e8);
  }
  else {
    *iStack_100._M_current = (char *)0x0;
    iStack_100._M_current = iStack_100._M_current + 1;
  }
  cmProcessTools::OutputLogger::OutputLogger
            ((OutputLogger *)local_e8,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
             "update-out> ");
  cmProcessTools::OutputLogger::OutputLogger
            ((OutputLogger *)local_88,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
             "update-err> ");
  bVar3 = cmCTestVC::RunUpdateCommand
                    ((cmCTestVC *)this,local_108,(OutputParser *)local_e8,(OutputParser *)local_88,
                     Auto);
  local_88._0_8_ = &PTR__LineParser_007830e8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._24_8_ != &local_60) {
    operator_delete((void *)local_88._24_8_,local_60._M_allocated_capacity + 1);
  }
  local_e8._0_8_ = &PTR__LineParser_007830e8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._24_8_ != &local_c0) {
    operator_delete((void *)local_e8._24_8_,local_c0._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  if ((cmSystemTools *)local_a8._0_8_ != (cmSystemTools *)local_98) {
    operator_delete((void *)local_a8._0_8_,(ulong)((long)local_98[0] + 1));
  }
  if (local_108 != (char **)0x0) {
    operator_delete(local_108,(long)local_f8 - (long)local_108);
  }
  return bVar3;
}

Assistant:

bool cmCTestHG::UpdateImpl()
{
  // Use "hg pull" followed by "hg update" to update the working tree.
  {
    const char* hg = this->CommandLineTool.c_str();
    const char* hg_pull[] = { hg, "pull", "-v", CM_NULLPTR };
    OutputLogger out(this->Log, "pull-out> ");
    OutputLogger err(this->Log, "pull-err> ");
    this->RunChild(&hg_pull[0], &out, &err);
  }

  // TODO: if(this->CTest->GetTestModel() == cmCTest::NIGHTLY)

  std::vector<char const*> hg_update;
  hg_update.push_back(this->CommandLineTool.c_str());
  hg_update.push_back("update");
  hg_update.push_back("-v");

  // Add user-specified update options.
  std::string opts = this->CTest->GetCTestConfiguration("UpdateOptions");
  if (opts.empty()) {
    opts = this->CTest->GetCTestConfiguration("HGUpdateOptions");
  }
  std::vector<std::string> args = cmSystemTools::ParseArguments(opts.c_str());
  for (std::vector<std::string>::const_iterator ai = args.begin();
       ai != args.end(); ++ai) {
    hg_update.push_back(ai->c_str());
  }

  // Sentinel argument.
  hg_update.push_back(CM_NULLPTR);

  OutputLogger out(this->Log, "update-out> ");
  OutputLogger err(this->Log, "update-err> ");
  return this->RunUpdateCommand(&hg_update[0], &out, &err);
}